

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclaredType.cpp
# Opt level: O3

bool slang::ast::isValidForUserDefinedNet(Type *type)

{
  SymbolKind SVar1;
  SyntaxNode *pSVar2;
  bool bVar3;
  bool bVar4;
  Type *pTVar5;
  Type *pTVar6;
  long lVar7;
  
  while( true ) {
    pTVar6 = type->canonical;
    if (pTVar6 == (Type *)0x0) {
      Type::resolveCanonical(type);
      pTVar6 = type->canonical;
    }
    bVar3 = Type::isIntegral(pTVar6);
    bVar4 = true;
    if (bVar3) {
      return true;
    }
    pTVar5 = pTVar6->canonical;
    if (pTVar5 == (Type *)0x0) {
      Type::resolveCanonical(pTVar6);
      pTVar5 = pTVar6->canonical;
    }
    SVar1 = (pTVar5->super_Symbol).kind;
    if (SVar1 == FloatingType) break;
    if ((pTVar6->super_Symbol).kind != FixedSizeUnpackedArrayType) {
      if (SVar1 == UnpackedUnionType) {
        pTVar5 = pTVar6[1].canonical;
        if (pTVar5 != (Type *)0x0) {
          pSVar2 = pTVar6[1].super_Symbol.originatingSyntax;
          lVar7 = 0;
          do {
            pTVar6 = DeclaredType::getType
                               ((DeclaredType *)(*(long *)((long)&pSVar2->kind + lVar7) + 0x40));
            bVar4 = isValidForUserDefinedNet(pTVar6);
            if (!bVar4) {
              return bVar4;
            }
            bVar3 = (long)pTVar5 * 8 + -8 != lVar7;
            lVar7 = lVar7 + 8;
          } while (bVar3);
        }
      }
      else if (SVar1 == UnpackedStructType) {
        pTVar5 = pTVar6[1].canonical;
        if (pTVar5 != (Type *)0x0) {
          pSVar2 = pTVar6[1].super_Symbol.originatingSyntax;
          lVar7 = 0;
          do {
            pTVar6 = DeclaredType::getType
                               ((DeclaredType *)(*(long *)((long)&pSVar2->kind + lVar7) + 0x40));
            bVar4 = isValidForUserDefinedNet(pTVar6);
            if (!bVar4) {
              return bVar4;
            }
            bVar3 = (long)pTVar5 * 8 + -8 != lVar7;
            lVar7 = lVar7 + 8;
          } while (bVar3);
        }
      }
      else {
        bVar4 = false;
      }
      return bVar4;
    }
    type = *(Type **)&pTVar6[1].super_Symbol;
  }
  return true;
}

Assistant:

static bool isValidForUserDefinedNet(const Type& type) {
    auto& ct = type.getCanonicalType();
    if (ct.isIntegral() || ct.isFloating())
        return true;

    if (ct.kind == SymbolKind::FixedSizeUnpackedArrayType)
        return isValidForUserDefinedNet(ct.as<FixedSizeUnpackedArrayType>().elementType);

    if (ct.isUnpackedStruct()) {
        for (auto field : ct.as<UnpackedStructType>().fields) {
            if (!isValidForUserDefinedNet(field->getType()))
                return false;
        }
        return true;
    }

    if (ct.isUnpackedUnion()) {
        for (auto field : ct.as<UnpackedUnionType>().fields) {
            if (!isValidForUserDefinedNet(field->getType()))
                return false;
        }
        return true;
    }

    return false;
}